

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O3

void init_objects(void)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uchar uVar4;
  short sVar5;
  short sVar6;
  objclass *poVar7;
  objclass *poVar8;
  uint uVar9;
  int iVar10;
  short *psVar11;
  byte *pbVar12;
  objclass *poVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  char *pcVar22;
  int iVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  bases[0xc] = 0;
  bases[0xd] = 0;
  bases[0xe] = 0;
  bases[0xf] = 0;
  bases[8] = 0;
  bases[9] = 0;
  bases[10] = 0;
  bases[0xb] = 0;
  bases[4] = 0;
  bases[5] = 0;
  bases[6] = 0;
  bases[7] = 0;
  bases[0] = 0;
  bases[1] = 0;
  bases[2] = 0;
  bases[3] = 0;
  bases[0x10] = 0;
  bases[0x11] = 0;
  psVar11 = &objects->oc_descr_idx;
  lVar14 = 0;
  do {
    *psVar11 = (short)lVar14;
    ((objclass *)(psVar11 + -1))->oc_name_idx = (short)lVar14;
    lVar14 = lVar14 + 1;
    psVar11 = psVar11 + 0x14;
  } while (lVar14 != 0x21a);
  poVar13 = objects;
  auVar27 = _DAT_002ab9d0;
  auVar28 = _DAT_002ab9e0;
  iVar20 = 0;
  do {
    lVar14 = (long)iVar20;
    cVar1 = poVar13[lVar14].oc_class;
    iVar18 = 0x219;
    if (0x219 < iVar20) {
      iVar18 = iVar20;
    }
    iVar23 = iVar18 + 1;
    pcVar22 = &poVar13[lVar14 + 1].oc_class;
    lVar17 = lVar14;
    do {
      lVar15 = lVar17;
      if (0x218 < lVar15) goto LAB_00209d7e;
      cVar2 = *pcVar22;
      pcVar22 = pcVar22 + 0x28;
      lVar17 = lVar15 + 1;
    } while (cVar2 == cVar1);
    iVar18 = (int)lVar15;
    iVar23 = (int)(lVar15 + 1);
LAB_00209d7e:
    bases[(int)cVar1] = iVar20;
    if (cVar1 == '\r') {
      setgemprobs((d_level *)0x0);
      uVar9 = mt_random();
      poVar13 = objects;
      if ((uVar9 & 1) != 0) {
        objects[0x1f7].oc_descr_idx = objects[500].oc_descr_idx;
        poVar13[0x1f7].oc_color = poVar13[500].oc_color;
      }
      uVar9 = mt_random();
      poVar13 = objects;
      if ((uVar9 & 1) != 0) {
        objects[0x1f9].oc_descr_idx = objects[500].oc_descr_idx;
        poVar13[0x1f9].oc_color = poVar13[500].oc_color;
      }
      uVar9 = mt_random();
      poVar13 = objects;
      auVar28 = _DAT_002ab9e0;
      auVar27 = _DAT_002ab9d0;
      switch(uVar9 & 3) {
      case 0:
        goto switchD_00209e0e_caseD_0;
      case 1:
        lVar17 = 0x4e37;
        lVar15 = 0x4e22;
        break;
      case 2:
        lVar17 = 0x4dbf;
        lVar15 = 0x4daa;
        break;
      case 3:
        lVar17 = 0x4e87;
        lVar15 = 0x4e72;
      }
      objects[0x202].oc_descr_idx = *(short *)((long)&objects->oc_name_idx + lVar15);
      poVar13[0x202].oc_color = *(uchar *)((long)&poVar13->oc_name_idx + lVar17);
    }
switchD_00209e0e_caseD_0:
    poVar13 = objects;
    uVar9 = iVar18 - iVar20;
    auVar25._4_4_ = 0;
    auVar25._0_4_ = uVar9;
    auVar25._8_4_ = uVar9;
    auVar25._12_4_ = 0;
    poVar7 = objects + lVar14;
    poVar8 = objects + lVar14 + 1;
    auVar25 = auVar25 ^ auVar28;
    while( true ) {
      do {
      } while (iVar18 < iVar20);
      iVar16 = 0;
      psVar11 = &poVar7->oc_prob;
      iVar10 = iVar20 + -1;
      do {
        iVar16 = iVar16 + *psVar11;
        psVar11 = psVar11 + 0x14;
        iVar10 = iVar10 + 1;
      } while (iVar18 != iVar10);
      if (iVar16 != 0) break;
      if (iVar20 <= iVar18) {
        uVar24 = 0;
        psVar11 = &poVar8->oc_prob;
        do {
          iVar10 = (int)uVar24;
          auVar26._8_4_ = iVar10;
          auVar26._0_8_ = uVar24;
          auVar26._12_4_ = (int)(uVar24 >> 0x20);
          auVar26 = (auVar26 | auVar27) ^ auVar28;
          if ((bool)(~(auVar25._4_4_ < auVar26._4_4_ ||
                      auVar25._0_4_ < auVar26._0_4_ && auVar26._4_4_ == auVar25._4_4_) & 1)) {
            psVar11[-0x14] = (short)((iVar10 + 1000) / (iVar23 - iVar20));
          }
          if (auVar26._12_4_ <= auVar25._12_4_ &&
              (auVar26._8_4_ <= auVar25._8_4_ || auVar26._12_4_ != auVar25._12_4_)) {
            *psVar11 = (short)((iVar10 + 0x3e9) / (iVar23 - iVar20));
          }
          uVar24 = uVar24 + 2;
          psVar11 = psVar11 + 0x28;
        } while (((ulong)uVar9 + 2 & 0xfffffffffffffffe) != uVar24);
      }
    }
    if (iVar16 != 1000) {
      raw_printf("init-prob error for class %d (%d%%)\n",(ulong)(uint)(int)cVar1);
      poVar13 = objects;
      auVar27 = _DAT_002ab9d0;
      auVar28 = _DAT_002ab9e0;
    }
    iVar20 = iVar23;
    if (0x218 < iVar18) {
      uVar24 = 1;
      poVar13 = objects;
      do {
        uVar9 = bases[uVar24];
        lVar14 = (long)(int)uVar9;
        uVar21 = 0x219;
        if (0x219 < (int)uVar9) {
          uVar21 = (ulong)uVar9;
        }
        pcVar22 = &poVar13[lVar14 + 1].oc_class;
        lVar17 = 0;
        do {
          if (lVar14 - uVar21 == lVar17) goto LAB_00209fc3;
          cVar1 = *pcVar22;
          lVar17 = lVar17 + -1;
          pcVar22 = pcVar22 + 0x28;
        } while (uVar24 == (uint)(int)cVar1);
        uVar21 = (ulong)(~(uint)lVar17 + uVar9);
LAB_00209fc3:
        iVar20 = (int)uVar21;
        if ((((uVar24 != 0xd) && (uVar24 != 8)) && (uVar24 != 3)) &&
           ((uVar19 = (uint)uVar24, (uVar19 & 0x1b) != 2 &&
            (obj_descr[poVar13[lVar14].oc_descr_idx].oc_descr != (char *)0x0)))) {
          if ((uVar19 < 0xb) && ((0x620U >> (uVar19 & 0x1f) & 1) != 0)) {
            lVar14 = (long)iVar20;
            iVar20 = iVar20 + 1;
            pbVar12 = &poVar13[lVar14].field_0x10;
            do {
              bVar3 = *pbVar12;
              iVar20 = iVar20 + -1;
              pbVar12 = pbVar12 + -0x28;
            } while ((bVar3 & 0x50) != 0x10);
          }
          shuffle(uVar9,iVar20,'\x01');
          poVar13 = objects;
        }
        uVar24 = uVar24 + 1;
        if (uVar24 == 0x12) {
          lVar14 = 0;
          shuffle(0x50,0x53,'\0');
          shuffle(0x8f,0x92,'\0');
          shuffle(0x84,0x87,'\0');
          shuffle(0x96,0x9c,'\0');
          uVar24 = 10;
          do {
            uVar9 = mt_random();
            poVar13 = objects;
            iVar20 = (int)((ulong)uVar9 % (uVar24 & 0xffffffff));
            uVar9 = iVar20 + 0x5f;
            sVar5 = *(short *)((long)&objects[0x68].oc_descr_idx + lVar14);
            uVar4 = (&objects[0x68].oc_color)[lVar14];
            sVar6 = *(short *)((long)&objects[0x68].oc_cost + lVar14);
            *(short *)((long)&objects[0x68].oc_descr_idx + lVar14) = objects[uVar9].oc_descr_idx;
            (&poVar13[0x68].oc_color)[lVar14] = poVar13[uVar9].oc_color;
            *(short *)((long)&poVar13[0x68].oc_cost + lVar14) = poVar13[uVar9].oc_cost;
            poVar13[uVar9].oc_descr_idx = sVar5;
            poVar13[uVar9].oc_color = uVar4;
            poVar13[uVar9].oc_cost = sVar6;
            uVar9 = iVar20 + 0x54;
            sVar5 = *(short *)((long)&poVar13[0x5d].oc_descr_idx + lVar14);
            uVar4 = (&poVar13[0x5d].oc_color)[lVar14];
            sVar6 = *(short *)((long)&poVar13[0x5d].oc_cost + lVar14);
            *(short *)((long)&poVar13[0x5d].oc_descr_idx + lVar14) = poVar13[uVar9].oc_descr_idx;
            (&poVar13[0x5d].oc_color)[lVar14] = poVar13[uVar9].oc_color;
            *(short *)((long)&poVar13[0x5d].oc_cost + lVar14) = poVar13[uVar9].oc_cost;
            poVar13[uVar9].oc_descr_idx = sVar5;
            poVar13[uVar9].oc_color = uVar4;
            poVar13[uVar9].oc_cost = sVar6;
            lVar14 = lVar14 + -0x28;
            uVar24 = uVar24 - 1;
          } while (uVar24 != 0);
          shuffle(bases[8],0x131,'\x01');
          shuffle(0x12d,0x13a,'\x01');
          shuffle(0x13b,0x14e,'\x01');
          shuffle(0x12d,0x142,'\x01');
          return;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void init_objects(void)
{
	int i, first, last, sum;
	char oclass;

	/* bug fix to prevent "initialization error" abort on Intel Xenix.
	 * reported by mikew@semike
	 */
	for (i = 0; i < MAXOCLASSES; i++)
		bases[i] = 0;
	/* initialize object descriptions */
	for (i = 0; i < NUM_OBJECTS; i++)
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;
	/* init base; if probs given check that they add up to 1000,
	   otherwise compute probs */
	first = 0;
	while ( first < NUM_OBJECTS ) {
		oclass = objects[first].oc_class;
		last = first+1;
		while (last < NUM_OBJECTS && objects[last].oc_class == oclass) last++;
		bases[(int)oclass] = first;

		if (oclass == GEM_CLASS) {
			setgemprobs(NULL);

			if (rn2(2)) { /* change turquoise from green to blue? */
			    COPY_OBJ_DESCR(objects[TURQUOISE],objects[SAPPHIRE]);
			}
			if (rn2(2)) { /* change aquamarine from green to blue? */
			    COPY_OBJ_DESCR(objects[AQUAMARINE],objects[SAPPHIRE]);
			}
			switch (rn2(4)) { /* change fluorite from violet? */
			    case 0:  break;
			    case 1:	/* blue */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[SAPPHIRE]);
				break;
			    case 2:	/* white */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[DIAMOND]);
				break;
			    case 3:	/* green */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[EMERALD]);
				break;
			}
		}
	check:
		sum = 0;
		for (i = first; i < last; i++) sum += objects[i].oc_prob;
		if (sum == 0) {
			for (i = first; i < last; i++)
			    objects[i].oc_prob = (1000+i-first)/(last-first);
			goto check;
		}
		if (sum != 1000)
			raw_printf("init-prob error for class %d (%d%%)\n", oclass, sum);
		
		first = last;
	}
	/* shuffle descriptions */
	shuffle_all();
}